

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O1

int Intp_ManProofTraceOne(Intp_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  ulong uVar1;
  lit lVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Sto_Cls_t *pSVar5;
  lit *plVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  Vec_Int_t *p_00;
  int *piVar10;
  void **ppvVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  timespec ts;
  uint local_64;
  timespec local_50;
  long local_40;
  long local_38;
  
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->fProofVerif != 0) {
    uVar14 = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
    if (p->nResLitsAlloc < (int)uVar14) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x1e3,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(uVar14 << 2));
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  if ((*(uint *)&pConflict->field_0x1c & 0x7fffff8) != 0) {
    uVar9 = 0;
    do {
      p->pSeens[*(int *)((long)&pConflict[1].pNext + uVar9 * 4) >> 1] = '\x01';
      uVar9 = uVar9 + 1;
    } while (uVar9 < (*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff));
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  p_00->pArray = piVar10;
  if (p->vAntClas->nSize != pFinal->Id - p->nAntStart) {
    __assert_fail("Vec_PtrSize(p->vAntClas) == pFinal->Id - p->nAntStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x1f5,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  Vec_IntPush(p_00,pConflict->Id);
  pVVar4 = p->vAntClas;
  uVar14 = pVVar4->nCap;
  if (pVVar4->nSize == uVar14) {
    if ((int)uVar14 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar11 = (void **)malloc(0x80);
      }
      else {
        ppvVar11 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar11;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar14 * 2;
      if (iVar8 <= (int)uVar14) goto LAB_008e7082;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar11 = (void **)malloc((ulong)uVar14 << 4);
      }
      else {
        ppvVar11 = (void **)realloc(pVVar4->pArray,(ulong)uVar14 << 4);
      }
      pVVar4->pArray = ppvVar11;
    }
    pVVar4->nCap = iVar8;
  }
LAB_008e7082:
  iVar8 = pVVar4->nSize;
  pVVar4->nSize = iVar8 + 1;
  pVVar4->pArray[iVar8] = p_00;
  if (0 < (long)p->nTrailSize) {
    local_64 = p->pProofNums[pConflict->Id];
    lVar13 = (long)p->nTrailSize;
    do {
      lVar19 = lVar13 + -1;
      uVar14 = p->pTrail[lVar13 + -1] >> 1;
      lVar17 = lVar13;
      if (p->pSeens[(int)uVar14] != '\0') {
        p->pSeens[(int)uVar14] = '\0';
        pSVar5 = p->pReasons[(int)uVar14];
        if (pSVar5 != (Sto_Cls_t *)0x0) {
          local_38 = lVar13;
          if (p->pTrail[lVar19] != *(int *)&pSVar5[1].pNext) {
            __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                          ,0x20b,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)"
                         );
          }
          if ((*(uint *)&pSVar5->field_0x1c & 0x7fffff0) != 0) {
            lVar13 = 9;
            do {
              p->pSeens[*(int *)((long)&pSVar5->pNext + lVar13 * 4) >> 1] = '\x01';
              uVar9 = lVar13 - 7;
              lVar13 = lVar13 + 1;
            } while (uVar9 < (*(uint *)&pSVar5->field_0x1c >> 3 & 0xffffff));
          }
          iVar8 = pSVar5->Id;
          if (p->pProofNums[iVar8] < 1) {
            __assert_fail("Intp_ManProofGet(p, pReason) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                          ,0x213,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)"
                         );
          }
          uVar15 = p->Counter + 1;
          p->Counter = uVar15;
          if (p->fProofWrite != 0) {
            fprintf((FILE *)p->pFile,"%d * %d %d 0\n",(ulong)uVar15,(ulong)local_64,
                    (ulong)(uint)p->pProofNums[iVar8]);
          }
          local_64 = p->Counter;
          if (p->fProofVerif != 0) {
            uVar15 = p->nResLits;
            if ((int)uVar15 < 1) {
              uVar9 = 0;
            }
            else {
              uVar9 = 0;
              do {
                if (p->pResLits[uVar9] >> 1 == uVar14) goto LAB_008e71c5;
                uVar9 = uVar9 + 1;
              } while (uVar15 != uVar9);
              uVar9 = (ulong)uVar15;
            }
LAB_008e71c5:
            local_40 = lVar19;
            if ((uint)uVar9 == uVar15) {
              printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar14);
            }
            uVar12 = uVar9 & 0xffffffff;
            if ((*(uint *)&pSVar5[1].pNext ^ p->pResLits[uVar12]) != 1) {
              printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar14);
            }
            lVar19 = local_40;
            if (p->pResLits[uVar12] >> 1 != uVar14) {
              __assert_fail("lit_var(p->pResLits[v1]) == Var",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                            ,0x230,
                            "int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
            }
            iVar8 = p->nResLits + -1;
            p->nResLits = iVar8;
            if ((int)(uint)uVar9 < iVar8) {
              plVar6 = p->pResLits + uVar12;
              do {
                *plVar6 = plVar6[1];
                uVar14 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar14;
                plVar6 = plVar6 + 1;
              } while ((int)uVar14 < p->nResLits);
            }
            if ((*(uint *)&pSVar5->field_0x1c & 0x7fffff0) != 0) {
              uVar9 = 1;
              do {
                uVar14 = p->nResLits;
                if ((int)uVar14 < 1) {
                  uVar12 = 0;
                }
                else {
                  uVar12 = 0;
                  do {
                    if ((p->pResLits[uVar12] ^ *(uint *)((long)&pSVar5[1].pNext + uVar9 * 4)) < 2)
                    goto LAB_008e7289;
                    uVar12 = uVar12 + 1;
                  } while (uVar14 != uVar12);
                  uVar12 = (ulong)uVar14;
                }
LAB_008e7289:
                if ((uint)uVar12 == uVar14) {
                  if (uVar14 == p->nResLitsAlloc) {
                    printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                           (ulong)(uint)pFinal->Id);
                  }
                  lVar2 = *(lit *)((long)&pSVar5[1].pNext + uVar9 * 4);
                  iVar8 = p->nResLits;
                  p->nResLits = iVar8 + 1;
                  p->pResLits[iVar8] = lVar2;
                }
                else if (p->pResLits[uVar12 & 0xffffffff] !=
                         *(int *)((long)&pSVar5[1].pNext + uVar9 * 4)) {
                  printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
                         ,(ulong)(uint)pFinal->Id);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < (*(uint *)&pSVar5->field_0x1c >> 3 & 0xffffff));
            }
          }
          lVar13 = (long)p->vAntClas->nSize;
          if (lVar13 < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
          }
          Vec_IntPush((Vec_Int_t *)p->vAntClas->pArray[lVar13 + -1],pSVar5->Id);
          lVar17 = local_38;
        }
      }
      lVar13 = lVar19;
    } while (1 < lVar17);
  }
  if (p->fProofVerif != 0) {
    uVar9 = (ulong)p->nResLits;
    if (0 < (long)uVar9) {
      uVar14 = *(uint *)&pFinal->field_0x1c >> 3 & 0xffffff;
      uVar12 = 0;
      bVar21 = 0 < (long)uVar9;
      do {
        bVar7 = 0 < (long)uVar9;
        if (uVar14 == 0) {
LAB_008e73a7:
          if (bVar7) {
            printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
            Intp_ManPrintClause(p,pConflict);
            Intp_ManPrintResolvent(p->pResLits,p->nResLits);
            Intp_ManPrintClause(p,pFinal);
          }
          break;
        }
        bVar20 = uVar14 != 0;
        bVar7 = bVar21;
        if (*(int *)&pFinal[1].pNext != p->pResLits[uVar12]) {
          uVar18 = 0;
          do {
            if ((ulong)uVar14 - 1 == uVar18) goto LAB_008e73a7;
            uVar1 = uVar18 + 1;
            lVar13 = uVar18 * 4;
            uVar18 = uVar1;
          } while (*(int *)((long)&pFinal[1].pNext + lVar13 + 4) != p->pResLits[uVar12]);
          bVar20 = uVar1 < uVar14;
        }
        if (!bVar20) goto LAB_008e73a7;
        uVar12 = uVar12 + 1;
        bVar21 = uVar12 < uVar9;
      } while (uVar12 != uVar9);
    }
    piVar10 = &p->nResLits;
    if (*piVar10 != (*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff)) {
      uVar14 = *(uint *)&pFinal->field_0x1c;
      uVar15 = uVar14 >> 3 & 0xffffff;
      if (uVar15 != 0) {
        iVar8 = 0;
        do {
          uVar9 = (ulong)*piVar10;
          bVar21 = 0 < (long)uVar9;
          if ((long)uVar9 < 1) {
LAB_008e7456:
            *(uint *)&pFinal->field_0x1c = uVar14 & 0xf8000007 | uVar14 + 0x7fffff8 & 0x7fffff8;
            if (iVar8 < (int)(uVar14 + 0x7fffff8 >> 3 & 0xffffff)) {
              lVar13 = (long)iVar8;
              do {
                *(undefined4 *)((long)&pFinal[1].pNext + lVar13 * 4) =
                     *(undefined4 *)((long)&pFinal[1].pNext + lVar13 * 4 + 4);
                lVar13 = lVar13 + 1;
              } while (lVar13 < (long)(ulong)(*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff));
            }
            iVar8 = iVar8 + -1;
          }
          else {
            iVar3 = *(int *)((long)&pFinal[1].pNext + (long)iVar8 * 4);
            if (iVar3 != *p->pResLits) {
              uVar12 = 0;
              do {
                if (uVar9 - 1 == uVar12) goto LAB_008e7456;
                uVar18 = uVar12 + 1;
                lVar13 = uVar12 + 1;
                uVar12 = uVar18;
              } while (iVar3 != p->pResLits[lVar13]);
              bVar21 = uVar18 < uVar9;
            }
            if (!bVar21) goto LAB_008e7456;
          }
          iVar8 = iVar8 + 1;
          uVar14 = *(uint *)&pFinal->field_0x1c;
          uVar15 = uVar14 >> 3 & 0xffffff;
        } while (iVar8 < (int)uVar15);
      }
      if (*piVar10 != uVar15) {
        __assert_fail("p->nResLits == (int)pFinal->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x27f,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
      }
    }
  }
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeTrace = p->timeTrace + lVar13 + lVar16;
  piVar10 = p->pProofNums;
  piVar10[pFinal->Id] = p->Counter;
  if (piVar10[(long)pFinal->Id + -1] == p->Counter) {
    __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x28b,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  return p->Counter;
}

Assistant:

int Intp_ManProofTraceOne( Intp_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

//    assert( pFinal->Id == Vec_IntSize(p->vBreaks) );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
//    Vec_IntPush( p->vAnties, pConflict->Id );
    {
        Vec_Int_t * vAnts = Vec_IntAlloc( 16 );
        assert( Vec_PtrSize(p->vAntClas) == pFinal->Id - p->nAntStart );
        Vec_IntPush( vAnts, pConflict->Id );
        Vec_PtrPush( p->vAntClas, vAnts );
    }

//    if ( p->pCnf->nClausesA )
//        Intp_ManAigCopy( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pConflict) );

    // follow the trail backwards
    PrevId = Intp_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Intp_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Intp_ManProofGet(p, pReason) );
        PrevId = p->Counter;

//        if ( p->pCnf->nClausesA )
//       {
//            if ( p->pVarTypes[Var] == 1 ) // var of A
//                Intp_ManAigOr( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pReason) );
//            else
//                Intp_ManAigAnd( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pReason) );
//        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Intp_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
//        Vec_IntPush( p->vAnties, pReason->Id );
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntryLast(p->vAntClas), pReason->Id );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Intp_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Intp_ManPrintClause( p, pConflict );
            Intp_ManPrintResolvent( p->pResLits, p->nResLits );
            Intp_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
//    if ( p->pCnf->nClausesA )
//    {
//        Intp_ManPrintInterOne( p, pFinal );
//    }
    Intp_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
//    if ( p->pProofNums[pFinal->Id] == p->pProofNums[pFinal->Id-1] )
//        p->pProofNums[pFinal->Id] = p->pProofNums[pConflict->Id];
    return p->Counter;
}